

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remoteallocator.h
# Opt level: O0

Alloc<BatchedRemoteMessage> snmalloc::BatchedRemoteMessage::from_message_link(HeadPtr chainPtr)

{
  HeadPtr chainPtr_local;
  
  return (Alloc<BatchedRemoteMessage>)(BatchedRemoteMessage *)(chainPtr.unsafe_capptr + -1);
}

Assistant:

static capptr::Alloc<BatchedRemoteMessage>
    from_message_link(freelist::HeadPtr chainPtr)
    {
      return pointer_offset_signed(
               chainPtr,
               -static_cast<ptrdiff_t>(
                 offsetof(BatchedRemoteMessage, message_link)))
        .as_reinterpret<BatchedRemoteMessage>();
    }